

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<float>::UpdateFrom
          (TPZBlockDiagonal<float> *this,TPZAutoPointer<TPZMatrix<float>_> *mat)

{
  TPZMatrix<float> *pTVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  long rows;
  long lVar5;
  TPZFMatrix<float> block;
  TPZFMatrix<float> local_c0;
  
  if ((mat->fRef != (TPZReference *)0x0) && (mat->fRef->fPointer != (TPZMatrix<float> *)0x0)) {
    (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
    lVar4 = (this->fBlockSize).fNElements;
    lVar5 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar5;
    }
    for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      rows = (long)(this->fBlockSize).fStore[lVar3];
      TPZFMatrix<float>::TPZFMatrix
                (&local_c0,rows,rows,(this->fStorage).fStore + (this->fBlockPos).fStore[lVar3],
                 rows * rows);
      pTVar1 = mat->fRef->fPointer;
      (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x2f])
                (pTVar1,lVar5,lVar5,rows,rows,&local_c0);
      lVar5 = lVar5 + rows;
      TPZFMatrix<float>::~TPZFMatrix(&local_c0);
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"TPZBlockDiagonal::UpdateFrom");
  std::operator<<(poVar2," called with zero argument\n");
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
	if(!mat) 
	{
		cout << "TPZBlockDiagonal::UpdateFrom" << " called with zero argument\n";
		return;
	}
	this->fDecomposed = ENoDecompose;
	int64_t nblock = fBlockSize.NElements();
	int64_t b,bsize,pos,firsteq = 0;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		//    int r,c;
		pos = fBlockPos[b];
		TPZFMatrix<TVar> block(bsize,bsize,&fStorage[pos],bsize*bsize);
		mat->GetSub(firsteq,firsteq,bsize,bsize,block);
		firsteq += bsize;
	}
}